

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  undefined1 *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar3;
  reference other;
  Value *this_02;
  const_iterator cVar4;
  bool local_2bd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  int local_1bc;
  undefined1 local_1b8 [8];
  String key;
  SelfType local_188;
  _Base_ptr local_178;
  undefined1 local_170;
  undefined1 local_168 [8];
  const_iterator si;
  allocator local_150;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d;
  allocator local_14c;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  iterator local_40;
  size_type local_38;
  Value *local_20;
  Value *invalid_local;
  StreamWriterBuilder *this_local;
  
  local_20 = invalid;
  invalid_local = (Value *)this;
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x30);
    si.super_ValueIteratorBase._12_1_ = 1;
    si.super_ValueIteratorBase._15_1_ = 1;
    local_148 = &local_140;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"indentation",&local_149);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"commentStyle",&local_14a);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"enableYAMLCompatibility",&local_14b);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"dropNullPlaceholders",&local_14c);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"useSpecialFloats",&local_14d);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"emitUTF8",&local_14e);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"precision",&local_14f);
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"precisionType",&local_150);
    si.super_ValueIteratorBase._15_1_ = 0;
    local_40 = &local_140;
    local_38 = 8;
    this_00 = &si.super_ValueIteratorBase.field_0xd;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    __l._M_len = local_38;
    __l._M_array = local_40;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(this_01,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &si.super_ValueIteratorBase.field_0xe,(allocator_type *)this_00);
    si.super_ValueIteratorBase._12_1_ = 0;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&si.super_ValueIteratorBase.field_0xd);
    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
    do {
      local_260 = local_260 + -1;
      std::__cxx11::string::~string((string *)local_260);
    } while (local_260 != &local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_14f);
    std::allocator<char>::~allocator((allocator<char> *)&local_14e);
    std::allocator<char>::~allocator((allocator<char> *)&local_14d);
    std::allocator<char>::~allocator((allocator<char> *)&local_14c);
    std::allocator<char>::~allocator((allocator<char> *)&local_14b);
    std::allocator<char>::~allocator((allocator<char> *)&local_14a);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = this_01;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
  }
  cVar4 = Value::begin(&this->settings_);
  local_178 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
  local_170 = cVar4.super_ValueIteratorBase.isNull_;
  local_168 = (undefined1  [8])local_178;
  si.super_ValueIteratorBase.current_._M_node._0_1_ = local_170;
  while( true ) {
    cVar4 = Value::end(&this->settings_);
    key.field_2._8_8_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_188.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    local_188.current_._M_node = (_Base_ptr)key.field_2._8_8_;
    bVar1 = ValueIteratorBase::operator!=((ValueIteratorBase *)local_168,&local_188);
    if (!bVar1) break;
    ValueIteratorBase::name_abi_cxx11_((String *)local_1b8,(ValueIteratorBase *)local_168);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(validate(Json::Value*)::valid_keys_abi_cxx11_,(String *)local_1b8);
    if (sVar3 == 0) {
      if (local_20 == (Value *)0x0) {
        this_local._7_1_ = 0;
        local_1bc = 1;
      }
      else {
        other = ValueConstIterator::operator*((ValueConstIterator *)local_168);
        this_02 = Value::operator[](local_20,(String *)local_1b8);
        Value::operator=(this_02,other);
        local_1bc = 0;
      }
    }
    else {
      local_1bc = 4;
    }
    std::__cxx11::string::~string((string *)local_1b8);
    if ((local_1bc != 0) && (local_1bc == 1)) goto LAB_0017be68;
    ValueConstIterator::operator++((ValueConstIterator *)local_168);
  }
  if (local_20 == (Value *)0x0) {
    local_2bd = true;
  }
  else {
    local_2bd = Value::empty(local_20);
  }
  this_local._7_1_ = local_2bd;
LAB_0017be68:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "indentation",
      "commentStyle",
      "enableYAMLCompatibility",
      "dropNullPlaceholders",
      "useSpecialFloats",
      "emitUTF8",
      "precision",
      "precisionType",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}